

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNSResolver.cpp
# Opt level: O1

void __thiscall DNSResolver::reciveAndParse(DNSResolver *this)

{
  ushort uVar1;
  ssize_t sVar2;
  size_t sVar3;
  uchar *puVar4;
  DNSResolver *__dest;
  ulong uVar5;
  int *piVar6;
  ushort uVar7;
  DNSResolver *this_00;
  long lVar8;
  uchar *reader;
  uchar *puVar9;
  int stop;
  RES_RECORD answers [20];
  long lStack_228;
  int local_21c;
  long *aplStack_218 [5];
  long *local_1f0;
  
  sVar2 = recv(this->sockfd,this,0x10000,0);
  if (sVar2 < 1) {
    piVar6 = __errno_location();
    if (*piVar6 != 0xb) {
      this->drop = true;
    }
  }
  else {
    this->responseRecived = true;
    this_00 = (DNSResolver *)this->qname;
    sVar3 = strlen((char *)this_00);
    puVar9 = this->buf + sVar3 + 0x11;
    local_21c = 0;
    lVar8 = 0x10;
    do {
      puVar4 = ReadName(this_00,puVar9,this->buf,&local_21c);
      *(uchar **)((long)&lStack_228 + lVar8) = puVar4;
      puVar4 = puVar9 + local_21c;
      *(uchar **)(&stack0xfffffffffffffde0 + lVar8) = puVar4;
      reader = puVar9 + local_21c + 10;
      if (*(short *)(puVar9 + local_21c) == 0x100) {
        this_00 = (DNSResolver *)
                  ((ulong)(ushort)(*(ushort *)(puVar4 + 8) << 8 | *(ushort *)(puVar4 + 8) >> 8) + 1)
        ;
        __dest = (DNSResolver *)malloc((size_t)this_00);
        *(DNSResolver **)((long)aplStack_218 + lVar8) = __dest;
        uVar1 = *(ushort *)(puVar4 + 8);
        uVar7 = uVar1 << 8 | uVar1 >> 8;
        if (uVar1 != 0) {
          uVar1 = 1;
          if (1 < uVar7) {
            uVar1 = uVar7;
          }
          this_00 = __dest;
          memcpy(__dest,reader,(ulong)uVar1);
        }
        uVar5 = (ulong)uVar7;
        __dest->buf[uVar5] = '\0';
      }
      else {
        puVar9 = ReadName(this_00,reader,this->buf,&local_21c);
        *(uchar **)((long)aplStack_218 + lVar8) = puVar9;
        uVar5 = (ulong)local_21c;
      }
      puVar9 = reader + uVar5;
      lVar8 = lVar8 + 0x18;
    } while (lVar8 == 0x28);
    uVar1 = this->dns->ans_count;
    if ((1 < (ushort)(uVar1 << 8 | uVar1 >> 8)) || (local_1f0 = aplStack_218[2], uVar1 != 0)) {
      this->s_addr = *local_1f0;
    }
    lVar8 = 0x10;
    do {
      free(*(void **)((long)aplStack_218 + lVar8));
      free(*(void **)((long)&lStack_228 + lVar8));
      lVar8 = lVar8 + 0x18;
    } while (lVar8 == 0x28);
  }
  return;
}

Assistant:

void DNSResolver::reciveAndParse() {
    if (::recv(sockfd, (char *) buf, 65536, 0) <= 0) {
        if (errno != EWOULDBLOCK) {
            drop = true;
        }
        return;
    }
    responseRecived = true;

    struct RES_RECORD answers[20];
    unsigned char *reader = &buf[sizeof(struct DNS_HEADER) + (strlen((const char *) qname) + 1) +
                                 sizeof(struct QUESTION)];

    //Start reading answers
    int stop = 0;
    for (int i = 0; i < 2; i++) {
        answers[i].name = ReadName(reader, buf, &stop);
        reader = reader + stop;

        answers[i].resource = (struct R_DATA *) (reader);
        reader = reader + sizeof(struct R_DATA);

        if (ntohs(answers[i].resource->type) == 1) //if its an ipv4 address
        {
            answers[i].rdata = (unsigned char *) malloc(ntohs(answers[i].resource->data_len) + 1);

            for (int j = 0; j < ntohs(answers[i].resource->data_len); j++) {
                answers[i].rdata[j] = reader[j];
            }

            answers[i].rdata[ntohs(answers[i].resource->data_len)] = '\0';

            reader = reader + ntohs(answers[i].resource->data_len);
        } else {
            answers[i].rdata = ReadName(reader, buf, &stop);
            reader = reader + stop;
        }
    }
    if (ntohs(dns->ans_count) > 1)
        s_addr = *((long *) answers[1].rdata);
    else if (ntohs(dns->ans_count) > 0)
        s_addr = *((long *) answers[0].rdata);
    for (int i = 0; i < 2; i++) {
               free(answers[i].rdata);
               free(answers[i].name);
    }
}